

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultIOSystem.cpp
# Opt level: O3

string * Assimp::DefaultIOSystem::completeBaseName(string *__return_storage_ptr__,string *path)

{
  long lVar1;
  long *local_30 [2];
  long local_20 [2];
  
  fileName(__return_storage_ptr__,path);
  lVar1 = std::__cxx11::string::rfind((char)__return_storage_ptr__,0x2e);
  if (lVar1 != -1) {
    std::__cxx11::string::substr((ulong)local_30,(ulong)__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_30);
    if (local_30[0] != local_20) {
      operator_delete(local_30[0],local_20[0] + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string DefaultIOSystem::completeBaseName(const std::string& path)
{
    std::string ret = fileName(path);
    std::size_t pos = ret.find_last_of('.');
    if (pos != std::string::npos) ret = ret.substr(0, pos);
    return ret;
}